

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O1

int OpenSSLWrapper::SslServerContext::SNI_CB(SSL *ssl,char param_2,void *arg)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  SSL *ssl_00;
  bool bVar3;
  int iVar4;
  char *__s;
  code *pcVar5;
  void *pvVar6;
  undefined8 *puVar7;
  size_t sVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  SSL_CTX *ctx;
  size_t sVar10;
  SslContext *this;
  bool bVar11;
  string strHostName;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fnDomainCompare;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  size_t local_e0;
  long local_d8 [2];
  undefined1 local_c8 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  SSL *local_80;
  SslContext *local_78;
  _Any_data local_70;
  code *local_60;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  local_80 = (SSL *)ssl;
  __s = SSL_get_servername((SSL *)ssl,0);
  ssl_00 = local_80;
  if (__s == (char *)0x0) {
    __s = (char *)0x0;
    pcVar5 = (code *)SSL_get_ex_data(local_80,0);
    pvVar6 = SSL_get_ex_data(ssl_00,1);
    if (pvVar6 != (void *)0x0 && pcVar5 != (code *)0x0) {
      puVar7 = (undefined8 *)(*pcVar5)(pvVar6);
      __s = (char *)*puVar7;
    }
  }
  if (__s != (char *)0x0 && arg != (void *)0x0) {
    local_e8._M_current = (char *)local_d8;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,__s,__s + sVar8);
    sVar8 = local_e0;
    _Var2._M_current = local_e8._M_current;
    if (local_e0 != 0) {
      sVar10 = 0;
      do {
        iVar4 = tolower((int)*(_Var2._M_current + sVar10));
        *(char *)((long)_Var2._M_current + sVar10) = (char)iVar4;
        sVar10 = sVar10 + 1;
      } while (sVar8 != sVar10);
    }
    local_c8._0_8_ = (pointer)(local_c8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_e8._M_current,(long)local_e8._M_current + local_e0);
    local_98 = (code *)0x0;
    pcStack_90 = (code *)0x0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_a8._M_unused._M_object = operator_new(0x20);
    *(code **)local_a8._M_unused._0_8_ = (code *)((long)local_a8._M_unused._0_8_ + 0x10);
    if ((pointer)local_c8._0_8_ == (pointer)(local_c8 + 0x10)) {
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) = local_c8._16_8_;
      *(char **)((long)local_a8._M_unused._0_8_ + 0x18) = _Stack_b0._M_current;
    }
    else {
      *(undefined8 *)local_a8._M_unused._0_8_ = local_c8._0_8_;
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) = local_c8._16_8_;
    }
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = local_c8._8_8_;
    pcStack_90 = std::
                 _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/OpenSSLWraper.cpp:448:55)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/OpenSSLWraper.cpp:448:55)>
               ::_M_manager;
    this = *arg;
    local_78 = *(SslContext **)((long)arg + 8);
    if (this != local_78) {
      do {
        bVar11 = *(this->m_strCertComName)._M_dataplus._M_p == '^';
        if (bVar11) {
          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
          basic_regex<std::char_traits<char>,std::allocator<char>>
                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_50,
                     &this->m_strCertComName,0x10);
          local_c8._16_8_ = (pointer)0x0;
          _Stack_b0._M_current = (char *)0x0;
          local_c8._0_8_ = (pointer)0x0;
          local_c8._8_8_ = (pointer)0x0;
          bVar3 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (local_e8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_e8._M_current + local_e0),
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_c8,&local_50,0);
          if ((pointer)local_c8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
          }
          if (!bVar3) goto LAB_00122009;
          bVar11 = true;
          bVar1 = false;
          bVar3 = true;
        }
        else {
LAB_00122009:
          sVar8 = (this->m_strCertComName)._M_string_length;
          if ((sVar8 == local_e0) &&
             ((bVar3 = true, sVar8 == 0 ||
              (iVar4 = bcmp((this->m_strCertComName)._M_dataplus._M_p,local_e8._M_current,sVar8),
              iVar4 == 0)))) {
            bVar1 = false;
          }
          else {
            _Var9._M_current =
                 (this->m_vstrAltNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            __last._M_current =
                 (this->m_vstrAltNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            std::
            function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_70,
                       (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_a8);
            _Var9 = std::
                    find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<bool(std::__cxx11::string&)>>
                              (_Var9,__last,
                               (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)&local_70);
            bVar3 = _Var9._M_current !=
                    (this->m_vstrAltNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
            bVar1 = true;
          }
        }
        if ((bVar1) && (local_60 != (code *)0x0)) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        if (bVar11) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_50);
        }
        if (bVar3) {
          ctx = (SSL_CTX *)SslContext::operator()(this);
          SSL_set_SSL_CTX(local_80,ctx);
          if (bVar3) {
            if (local_98 != (code *)0x0) {
              (*local_98)(&local_a8,&local_a8,__destroy_functor);
            }
            if ((long *)local_e8._M_current != local_d8) {
              operator_delete(local_e8._M_current,local_d8[0] + 1);
            }
            return 0;
          }
        }
        this = (SslContext *)&this[1].m_strCertComName._M_string_length;
      } while (this != local_78);
    }
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if ((long *)local_e8._M_current != local_d8) {
      operator_delete(local_e8._M_current,local_d8[0] + 1);
    }
  }
  return 3;
}

Assistant:

int SslServerContext::SNI_CB(SSL* ssl, char /*iCmd*/, void* arg)
    {
        vector<SslServerContext>* pSslCtx = static_cast<vector<SslServerContext>*>(arg);

        const char* szHostName = SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);

        if (szHostName == nullptr)  // if the host name is not set, the connection was made by IP address, we use the IP of the interface the connection came in, to find the certificate
        {
            const string& (*fnForwarder)(void*) = reinterpret_cast<const string&(*)(void*)>(SSL_get_ex_data(ssl, 0));   // Index 0 = Funktion pointer to a static proxy function
            void* Obj = SSL_get_ex_data(ssl, 1);    // Index 1 is the "this" pointer of the SslTcpSocket how owns the ssl object
            if (fnForwarder != nullptr && Obj != nullptr)
                szHostName = fnForwarder(Obj).c_str(); // We get the IP address of the Interface the connection come in
        }

        if (pSslCtx != nullptr && szHostName != nullptr)
        {
            string strHostName(szHostName);
            transform(begin(strHostName), end(strHostName), begin(strHostName), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

            function<bool(string&)> fnDomainCompare = [strHostName](string& it) -> bool
            {
                if (it[0] == '^')   // we have a regular expression
                    return regex_match(strHostName, regex(it));
                else
                    return it.compare(strHostName) == 0 ? true : false;
            };

            for (auto& it : *pSslCtx)
            {
                if ((it.m_strCertComName[0] == '^' && regex_match(strHostName, regex(it.m_strCertComName))) || it.m_strCertComName == strHostName || find_if(begin(it.m_vstrAltNames), end(it.m_vstrAltNames), fnDomainCompare) != end(it.m_vstrAltNames))
                {
                    SSL_set_SSL_CTX(ssl, it());
                    return SSL_TLSEXT_ERR_OK;
                }
            }
        }

        return SSL_TLSEXT_ERR_NOACK;
    }